

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

void __thiscall
duckdb::Pipeline::AddDependency(Pipeline *this,shared_ptr<duckdb::Pipeline,_true> *pipeline)

{
  Pipeline *pPVar1;
  __weak_ptr<duckdb::Pipeline,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  ::std::__weak_ptr<duckdb::Pipeline,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<duckdb::Pipeline,void>
            (local_40,(__shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2> *)pipeline);
  ::std::
  vector<duckdb::weak_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::weak_ptr<duckdb::Pipeline,true>>>
  ::emplace_back<duckdb::weak_ptr<duckdb::Pipeline,true>>
            ((vector<duckdb::weak_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::weak_ptr<duckdb::Pipeline,true>>>
              *)&this->dependencies,(weak_ptr<duckdb::Pipeline,_true> *)local_40);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
  pPVar1 = shared_ptr<duckdb::Pipeline,_true>::operator->(pipeline);
  enable_shared_from_this<duckdb::Pipeline>::shared_from_this
            ((enable_shared_from_this<duckdb::Pipeline> *)&local_30);
  ::std::__weak_ptr<duckdb::Pipeline,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<duckdb::Pipeline,void>
            (local_40,&local_30);
  ::std::
  vector<duckdb::weak_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::weak_ptr<duckdb::Pipeline,true>>>
  ::emplace_back<duckdb::weak_ptr<duckdb::Pipeline,true>>
            ((vector<duckdb::weak_ptr<duckdb::Pipeline,true>,std::allocator<duckdb::weak_ptr<duckdb::Pipeline,true>>>
              *)&pPVar1->parents,(weak_ptr<duckdb::Pipeline,_true> *)local_40);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

void Pipeline::AddDependency(shared_ptr<Pipeline> &pipeline) {
	D_ASSERT(pipeline);
	dependencies.push_back(weak_ptr<Pipeline>(pipeline));
	pipeline->parents.push_back(weak_ptr<Pipeline>(shared_from_this()));
}